

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* ParseCommonOptions_abi_cxx11_
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,OptionMap *options,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  mapped_type *pmVar4;
  key_type local_64;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_60;
  int i;
  string argstr;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  i = 1;
  local_60 = __return_storage_ptr__;
  do {
    if (argc <= i) {
      return local_60;
    }
    GetNextArg_abi_cxx11_(&argstr,&i,argc,argv);
    bVar1 = std::operator==(&argstr,"-ve");
    if (bVar1) {
      iVar2 = GetIArg(&i,argc,argv);
      local_64 = ExternalVRR;
      piVar3 = std::
               map<Option,_int,_std::less<Option>,_std::allocator<std::pair<const_Option,_int>_>_>::
               operator[](options,&local_64);
LAB_00108d27:
      *piVar3 = iVar2;
    }
    else {
      bVar1 = std::operator==(&argstr,"-vg");
      if (bVar1) {
        iVar2 = GetIArg(&i,argc,argv);
        local_64 = GeneralVRR;
        piVar3 = std::
                 map<Option,_int,_std::less<Option>,_std::allocator<std::pair<const_Option,_int>_>_>
                 ::operator[](options,&local_64);
        goto LAB_00108d27;
      }
      bVar1 = std::operator==(&argstr,"-he");
      if (bVar1) {
        iVar2 = GetIArg(&i,argc,argv);
        local_64 = ExternalHRR;
        piVar3 = std::
                 map<Option,_int,_std::less<Option>,_std::allocator<std::pair<const_Option,_int>_>_>
                 ::operator[](options,&local_64);
        goto LAB_00108d27;
      }
      bVar1 = std::operator==(&argstr,"-hg");
      if (bVar1) {
        iVar2 = GetIArg(&i,argc,argv);
        local_64 = GeneralHRR;
        piVar3 = std::
                 map<Option,_int,_std::less<Option>,_std::allocator<std::pair<const_Option,_int>_>_>
                 ::operator[](options,&local_64);
        goto LAB_00108d27;
      }
      bVar1 = std::operator==(&argstr,"-p");
      if (bVar1) {
        local_64 = FinalPermute;
        pmVar4 = std::
                 map<Option,_int,_std::less<Option>,_std::allocator<std::pair<const_Option,_int>_>_>
                 ::operator[](options,&local_64);
        *pmVar4 = 1;
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_60,&argstr);
      }
    }
    std::__cxx11::string::~string((string *)&argstr);
  } while( true );
}

Assistant:

std::vector<std::string> ParseCommonOptions(OptionMap & options, int argc, char ** argv)
{
    std::vector<std::string> ret;

    int i = 1;
    while(i < argc)
    {
        std::string argstr(GetNextArg(i, argc, argv));
        if(argstr == "-ve")
            options[Option::ExternalVRR] = GetIArg(i, argc, argv);
        else if(argstr == "-vg")
            options[Option::GeneralVRR] = GetIArg(i, argc, argv);
        else if(argstr == "-he")
            options[Option::ExternalHRR] = GetIArg(i, argc, argv);
        else if(argstr == "-hg")
            options[Option::GeneralHRR] = GetIArg(i, argc, argv);
        else if(argstr == "-p")
            options[Option::FinalPermute] = 1;
        else
            ret.push_back(argstr);
    }

    return ret;
}